

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layer_declaration.h
# Opt level: O0

void __thiscall ncnn::Einsum_final::~Einsum_final(Einsum_final *this,void **vtt)

{
  void **vtt_local;
  Einsum_final *this_local;
  
  return;
}

Assistant:

virtual int create_pipeline(const Option& opt) {
        { int ret = Einsum::create_pipeline(opt); if (ret) return ret; }
        return 0;
    }